

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O0

int start_hash(gost_hash_ctx *ctx)

{
  long lVar1;
  undefined8 *in_RDI;
  uint local_4;
  
  lVar1 = in_RDI[1];
  if (lVar1 != 0) {
    memset((void *)((long)in_RDI + 0x14),0,0x20);
    memset((void *)((long)in_RDI + 0x34),0,0x20);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 2) = 0;
  }
  local_4 = (uint)(lVar1 != 0);
  return local_4;
}

Assistant:

int start_hash(gost_hash_ctx * ctx)
{
    if (!ctx->cipher_ctx)
        return 0;
    memset(&(ctx->H), 0, 32);
    memset(&(ctx->S), 0, 32);
    ctx->len = 0L;
    ctx->left = 0;
    return 1;
}